

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  ImGuiTabBar *this_local;
  
  ImVector<ImGuiTabItem>::ImVector(&this->Tabs);
  ImRect::ImRect(&this->BarRect);
  ImVec2::ImVec2(&this->FramePadding);
  ImGuiTextBuffer::ImGuiTextBuffer(&this->TabsNames);
  this->ID = 0;
  this->VisibleTabId = 0;
  this->NextSelectedTabId = 0;
  this->SelectedTabId = 0;
  this->PrevFrameVisible = -1;
  this->CurrFrameVisible = -1;
  this->ContentsHeight = 0.0;
  this->OffsetNextTab = 0.0;
  this->OffsetMax = 0.0;
  this->ScrollingSpeed = 0.0;
  this->ScrollingTargetDistToVisibility = 0.0;
  this->ScrollingTarget = 0.0;
  this->ScrollingAnim = 0.0;
  this->Flags = 0;
  this->ReorderRequestTabId = 0;
  this->ReorderRequestDir = '\0';
  this->VisibleTabWasSubmitted = false;
  this->WantLayout = false;
  this->LastTabItemIdx = -1;
  return;
}

Assistant:

ImGuiTabBar::ImGuiTabBar()
{
    ID = 0;
    SelectedTabId = NextSelectedTabId = VisibleTabId = 0;
    CurrFrameVisible = PrevFrameVisible = -1;
    ContentsHeight = 0.0f;
    OffsetMax = OffsetNextTab = 0.0f;
    ScrollingAnim = ScrollingTarget = ScrollingTargetDistToVisibility = ScrollingSpeed = 0.0f;
    Flags = ImGuiTabBarFlags_None;
    ReorderRequestTabId = 0;
    ReorderRequestDir = 0;
    WantLayout = VisibleTabWasSubmitted = false;
    LastTabItemIdx = -1;
}